

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall mario::TimerQueue::cancel(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  TimerQueue *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  Functor local_40;
  TimerQueue *local_20;
  TimerQueue *this_local;
  TimerId timerId_local;
  
  timerId_local._value = (Timer *)timerId._seq;
  this_local = (TimerQueue *)timerId._value;
  this_00 = this->_loop;
  local_78 = cancelInLoop;
  local_70 = 0;
  local_80 = this;
  local_20 = this;
  std::bind<void(mario::TimerQueue::*)(mario::TimerId),mario::TimerQueue*,mario::TimerId&>
            (&local_68,(offset_in_TimerQueue_to_subr *)&local_78,&local_80,(TimerId *)&this_local);
  std::function<void()>::
  function<std::_Bind<void(mario::TimerQueue::*(mario::TimerQueue*,mario::TimerId))(mario::TimerId)>,void>
            ((function<void()> *)&local_40,&local_68);
  EventLoop::runInLoop(this_00,&local_40);
  std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

void TimerQueue::cancel(TimerId timerId) {
    _loop->runInLoop(
            std::bind(&TimerQueue::cancelInLoop, this, timerId)
            );
}